

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_tests.cpp
# Opt level: O2

void skiwi::format_test_8(void)

{
  format_options ops;
  string res;
  allocator<char> local_d5;
  format_options local_d4 [4];
  undefined4 local_d0;
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [32];
  anon_unknown_0 local_28 [32];
  
  skiwi::format_options::format_options(local_d4);
  local_d0 = 10;
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,
             "(let([f(lambda(a0 a1 . args) (vector a0 a1))]) (f 10 20 30 40 50 60 70 80 90 100)) ",
             &local_d5);
  skiwi::format(local_48,(format_options *)local_c8);
  anon_unknown_0::cleanup(local_28,(EVP_PKEY_CTX *)local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,
             "\n(let ([f (lambda\n           (a0 a1 . args)\n           (vector a0 a1))])\n     (f 10 20 30 40 50 60 70 80 90 100))\n"
             ,(allocator<char> *)local_c8);
  anon_unknown_0::cleanup((anon_unknown_0 *)&local_68,(EVP_PKEY_CTX *)local_88);
  std::__cxx11::string::string((string *)&local_a8,(string *)local_28);
  TestEq<std::__cxx11::string,std::__cxx11::string>
            (&local_68,&local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/format_tests.cpp"
             ,0x114,"void skiwi::format_test_8()");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void format_test_8()
  {
  format_options ops;
  ops.max_width = 10;
  auto res = cleanup(format("(let([f(lambda(a0 a1 . args) (vector a0 a1))]) (f 10 20 30 40 50 60 70 80 90 100)) ", ops));
  TEST_EQ(cleanup(R"(
(let ([f (lambda
           (a0 a1 . args)
           (vector a0 a1))])
     (f 10 20 30 40 50 60 70 80 90 100))
)"), res);
  }